

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

string * BamTools::Internal::BamStandardIndex::Extension_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)&BAI_EXTENSION_abi_cxx11_);
  return in_RDI;
}

Assistant:

const std::string BamStandardIndex::Extension()
{
    return BamStandardIndex::BAI_EXTENSION;
}